

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O0

char * MyGame_Example2_foo_parse_json_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value,
                 int *aggregate)

{
  uint64_t uVar1;
  uint64_t w;
  char *mark;
  char *unmatched;
  int *aggregate_local;
  uint64_t *value_local;
  int *value_sign_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  uVar1 = flatcc_json_parser_symbol_part(buf,end);
  if (uVar1 < 0x7800000000000000) {
    if ((uVar1 & 0xffffffffff000000) != 0x7461626c65000000) {
      return buf;
    }
    end_local = flatcc_json_parser_match_constant(ctx,buf,end,5,aggregate);
    if (end_local == buf) {
      return buf;
    }
    *value = 2;
    *value_sign = 0;
  }
  else if ((uVar1 & 0xff00000000000000) == 0x7900000000000000) {
    end_local = flatcc_json_parser_match_constant(ctx,buf,end,1,aggregate);
    if (end_local == buf) {
      return buf;
    }
    *value = 1;
    *value_sign = 0;
  }
  else {
    if ((uVar1 & 0xff00000000000000) != 0x7800000000000000) {
      return buf;
    }
    end_local = flatcc_json_parser_match_constant(ctx,buf,end,1,aggregate);
    if (end_local == buf) {
      return buf;
    }
    *value = 0;
    *value_sign = 0;
  }
  return end_local;
}

Assistant:

static const char *MyGame_Example2_foo_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w < 0x7800000000000000) { /* branch "x" */
        if ((w & 0xffffffffff000000) == 0x7461626c65000000) { /* "table" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 5, aggregate);
            if (buf != mark) {
                *value = UINT64_C(2), *value_sign = 0;
            } else {
                return unmatched;
            }
        } else { /* "table" */
            return unmatched;
        } /* "table" */
    } else { /* branch "x" */
        if ((w & 0xff00000000000000) == 0x7900000000000000) { /* "y" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 1, aggregate);
            if (buf != mark) {
                *value = UINT64_C(1), *value_sign = 0;
            } else {
                return unmatched;
            }
        } else { /* "y" */
            if ((w & 0xff00000000000000) == 0x7800000000000000) { /* "x" */
                buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 1, aggregate);
                if (buf != mark) {
                    *value = UINT64_C(0), *value_sign = 0;
                } else {
                    return unmatched;
                }
            } else { /* "x" */
                return unmatched;
            } /* "x" */
        } /* "y" */
    } /* branch "x" */
    return buf;
}